

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall
imrt::Collimator::generateIntensityLevels(Collimator *this,int step_intensity,int max_intensity)

{
  vector<int,_std::allocator<int>_> *this_00;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *this_01;
  iterator iVar1;
  mapped_type *pmVar2;
  int iVar3;
  int aux;
  int local_44;
  key_type_conflict1 local_40;
  vector<int,std::allocator<int>> *local_38;
  
  local_44 = 0;
  this_00 = &this->levels_to_intensity;
  local_40 = (key_type_conflict1)((ulong)local_40 & 0xffffffff00000000);
  iVar1._M_current =
       (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,(int *)&local_40);
  }
  else {
    *iVar1._M_current = 0;
    (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this_01 = &this->intensity_to_levels;
  local_40 = 0.0;
  pmVar2 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[](this_01,&local_40);
  *pmVar2 = 0;
  local_40 = (key_type_conflict1)CONCAT44(local_40._4_4_,1);
  iVar1._M_current =
       (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = (vector<int,std::allocator<int>> *)this_00;
  if (iVar1._M_current ==
      (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,(int *)&local_40);
  }
  else {
    *iVar1._M_current = 1;
    (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_40 = 1.0;
  pmVar2 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[](this_01,&local_40);
  *pmVar2 = 1;
  local_44 = 1;
  if (1 < max_intensity) {
    iVar3 = 2;
    local_44 = 1;
    do {
      local_44 = local_44 + step_intensity;
      iVar1._M_current =
           (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_38,iVar1,&local_44);
      }
      else {
        *iVar1._M_current = local_44;
        (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_40 = (key_type_conflict1)local_44;
      pmVar2 = std::
               map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
               operator[](this_01,&local_40);
      *pmVar2 = iVar3;
      iVar3 = iVar3 + 1;
    } while (local_44 < max_intensity);
  }
  printIntensityLevels(this);
  return;
}

Assistant:

void Collimator::generateIntensityLevels (int step_intensity, int max_intensity) {
    int aux=0;
    // Level 0 and 1 are always in the set
    levels_to_intensity.push_back(0);
    intensity_to_levels[0.0] = 0;
    levels_to_intensity.push_back(1);
    intensity_to_levels[1.0] = 1;
    aux = 1;

    for (int i=2; aux< max_intensity; i++){
      aux = aux + step_intensity;
      levels_to_intensity.push_back(aux);
      intensity_to_levels[aux] = i;
    }
    printIntensityLevels ();
  }